

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample3DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,float t,float r,
          IVec3 *offset)

{
  int iVar1;
  FilterMode FVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float afVar7 [4];
  undefined1 auVar8 [16];
  Sampler *pSVar9;
  bool bVar10;
  int i;
  uint uVar11;
  uint uVar12;
  TextureChannelClass TVar13;
  long lVar14;
  FilterMode k;
  bool bVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  undefined4 in_register_00000014;
  Sampler *sampler_00;
  Vector<float,_4> *res_46;
  bool bVar19;
  FilterMode FVar20;
  FilterMode FVar21;
  int *in_R8;
  WrapMode WVar22;
  bool bVar23;
  byte bVar24;
  int iVar25;
  WrapMode WVar26;
  WrapMode WVar27;
  WrapMode WVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  uint uVar36;
  float fVar37;
  float fVar38;
  undefined8 extraout_XMM0_Qa;
  undefined1 in_register_00001204 [12];
  undefined1 in_register_00001244 [12];
  undefined1 auVar40 [16];
  ulong uVar39;
  undefined1 auVar41 [16];
  float fVar42;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  float fVar43;
  uint uVar44;
  Vector<float,_4> VVar45;
  Vec4 VVar46;
  Vec4 VVar47;
  Vector<float,_4> res_42;
  Vec4 p111;
  Vec4 p011;
  Vec4 p101;
  Vec4 p001;
  Vec4 p110;
  Vec4 p010;
  Vec4 p100;
  Vec4 p000;
  Vector<float,_4> res_43;
  Vector<float,_4> res_44;
  Vector<float,_4> res_45;
  Vector<float,_4> res_39;
  Vector<float,_4> res_40;
  Vector<float,_4> res_41;
  Vector<float,_4> res_35;
  Vector<float,_4> res_36;
  Vector<float,_4> res_37;
  Vector<float,_4> res_31;
  Vector<float,_4> res_32;
  Vector<float,_4> res_33;
  Vector<float,_4> res_27;
  Vector<float,_4> res_28;
  Vector<float,_4> res_29;
  Vector<float,_4> res_23;
  Vector<float,_4> res_24;
  Vector<float,_4> res_25;
  Vector<float,_4> res_19;
  Vector<float,_4> res_20;
  Vector<float,_4> res_21;
  Vector<float,_4> res_16;
  Vector<float,_4> res_17;
  Vector<float,_4> res_18;
  Vector<float,_4> res_22;
  Vector<float,_4> res_26;
  Vector<float,_4> res_30;
  Vector<float,_4> res_34;
  Vector<float,_4> res_38;
  WrapMode local_31c;
  uint local_310;
  uint local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  Sampler *local_2f0;
  undefined8 local_2e8;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d0;
  float local_2cc;
  undefined1 local_2c8 [16];
  float local_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint local_2a8;
  WrapMode local_2a4;
  ulong local_2a0;
  ulong local_298;
  float local_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [24];
  float afStack_200 [2];
  void *local_1f8;
  undefined8 uStack_1f0;
  float local_1e8 [110];
  Vec4 VVar48;
  Vec4 VVar49;
  Vec4 VVar50;
  Vec4 VVar51;
  Vec4 VVar52;
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  
  auVar40._4_12_ = in_register_00001244;
  auVar40._0_4_ = t;
  sampler_00 = (Sampler *)CONCAT44(in_register_00000014,filter);
  uVar11 = in_register_00001204._0_4_;
  uVar36 = in_register_00001204._4_4_;
  uVar18 = in_register_00001204._8_4_;
  local_2b8 = r;
  uStack_2b4 = in_XMM2_Db;
  uStack_2b0 = in_XMM2_Dc;
  uStack_2ac = in_XMM2_Dd;
  if (sampler_00->normalizedCoords == true) {
    WVar28 = sampler_00->wrapS;
    local_2e8._0_4_ = 0.0;
    local_2e8._4_4_ = 0;
    uVar44 = 0;
    uVar12 = 0;
    if (WVar28 < WRAPMODE_LAST) {
      fVar37 = (float)(int)sampler->wrapR;
      if ((0x57U >> (WVar28 & 0x1f) & 1) == 0) {
        uStack_2e0 = uVar36;
        uStack_2dc = uVar18;
        local_2c8 = auVar40;
        local_2e8._4_4_ = uVar11;
        if (WVar28 == REPEAT_CL) {
          local_2e8._0_4_ = s;
          fVar43 = floorf(s);
          local_2e8._0_4_ = ((float)local_2e8 - fVar43) * fVar37;
          auVar40 = local_2c8;
          uVar44 = uStack_2e0;
          uVar12 = uStack_2dc;
        }
        else {
          fVar42 = s * 0.5;
          local_2e8._0_4_ = s;
          fVar43 = floorf(fVar42);
          fVar43 = fVar42 - fVar43;
          if ((fVar43 != 0.5) || (NAN(fVar43))) {
            fVar38 = floorf(fVar42 + 0.5);
          }
          else {
            fVar38 = 0.0;
            if (((long)(fVar42 - fVar43) & 1U) != 0) {
              fVar38 = 1.0;
            }
            fVar38 = (fVar42 - fVar43) + fVar38;
          }
          local_2e8._0_4_ = (float)local_2e8 - (fVar38 + fVar38);
          uVar36 = -(uint)(-(float)local_2e8 <= (float)local_2e8);
          local_2e8._4_4_ = local_2e8._4_4_ & (local_2e8._4_4_ ^ 0x80000000);
          uVar44 = uStack_2e0 & (uStack_2e0 ^ 0x80000000);
          uVar12 = uStack_2dc & (uStack_2dc ^ 0x80000000);
          local_2e8._0_4_ =
               (float)(~uVar36 & (uint)-(float)local_2e8 | (uint)(float)local_2e8 & uVar36) * fVar37
          ;
          auVar40 = local_2c8;
        }
      }
      else {
        local_2e8._0_4_ = fVar37 * s;
        local_2e8._4_4_ = 0;
        uVar44 = 0;
        uVar12 = 0;
      }
    }
    local_2c8._0_4_ = 0.0;
    local_2c8._4_4_ = 0;
    local_2c8._8_4_ = 0;
    local_2c8._12_4_ = 0;
    WVar28 = sampler_00->wrapT;
    uVar36 = uVar44;
    uVar18 = uVar12;
    if (WVar28 < WRAPMODE_LAST) {
      fVar43 = (float)(int)sampler->minFilter;
      fVar37 = auVar40._0_4_;
      if ((0x57U >> (WVar28 & 0x1f) & 1) == 0) {
        uStack_2e0 = uVar44;
        uStack_2dc = uVar12;
        local_2c8 = auVar40;
        if (WVar28 == REPEAT_CL) {
          fVar37 = floorf(fVar37);
          local_2c8._0_4_ = ((float)local_2c8._0_4_ - fVar37) * fVar43;
          uVar36 = uStack_2e0;
          uVar18 = uStack_2dc;
        }
        else {
          fVar37 = fVar37 * 0.5;
          fVar42 = floorf(fVar37);
          fVar42 = fVar37 - fVar42;
          if ((fVar42 != 0.5) || (NAN(fVar42))) {
            fVar38 = floorf(fVar37 + 0.5);
          }
          else {
            fVar38 = 0.0;
            if (((long)(fVar37 - fVar42) & 1U) != 0) {
              fVar38 = 1.0;
            }
            fVar38 = (fVar37 - fVar42) + fVar38;
          }
          local_2c8._0_4_ = (float)local_2c8._0_4_ - (fVar38 + fVar38);
          auVar40._0_8_ = CONCAT44(local_2c8._4_4_,local_2c8._0_4_) ^ 0x8000000080000000;
          auVar40._8_4_ = local_2c8._8_4_ ^ 0x80000000;
          auVar40._12_4_ = local_2c8._12_4_ ^ 0x80000000;
          uVar36 = -(uint)(-(float)local_2c8._0_4_ <= (float)local_2c8._0_4_);
          local_2c8._4_4_ = local_2c8._4_4_ & (local_2c8._4_4_ ^ 0x80000000);
          local_2c8._8_4_ = local_2c8._8_4_ & auVar40._8_4_;
          local_2c8._12_4_ = local_2c8._12_4_ & auVar40._12_4_;
          local_2c8._0_4_ =
               (float)(~uVar36 & (uint)-(float)local_2c8._0_4_ | local_2c8._0_4_ & uVar36) * fVar43;
          uVar36 = uStack_2e0;
          uVar18 = uStack_2dc;
        }
      }
      else {
        local_2c8._0_4_ = fVar43 * fVar37;
        local_2c8._4_4_ = 0;
        local_2c8._8_4_ = 0;
        local_2c8._12_4_ = 0;
      }
    }
    WVar28 = sampler_00->wrapR;
    uVar11 = local_2e8._4_4_;
    if (WVar28 < WRAPMODE_LAST) {
      fVar37 = (float)(int)sampler->magFilter;
      auVar40 = ZEXT416((uint)fVar37);
      if ((0x57U >> (WVar28 & 0x1f) & 1) == 0) {
        uStack_2e0 = uVar36;
        uStack_2dc = uVar18;
        if (WVar28 == REPEAT_CL) {
          fVar43 = floorf(local_2b8);
          local_2b8 = (local_2b8 - fVar43) * fVar37;
          uVar11 = local_2e8._4_4_;
          uVar36 = uStack_2e0;
          uVar18 = uStack_2dc;
        }
        else {
          fVar43 = local_2b8 * 0.5;
          fVar42 = floorf(fVar43);
          fVar42 = fVar43 - fVar42;
          if ((fVar42 != 0.5) || (NAN(fVar42))) {
            fVar38 = floorf(fVar43 + 0.5);
          }
          else {
            fVar38 = 0.0;
            if (((long)(fVar43 - fVar42) & 1U) != 0) {
              fVar38 = 1.0;
            }
            fVar38 = (fVar43 - fVar42) + fVar38;
          }
          local_2b8 = local_2b8 - (fVar38 + fVar38);
          uVar36 = -(uint)(-local_2b8 <= local_2b8);
          auVar41._4_4_ = uStack_2b4 & (uStack_2b4 ^ 0x80000000);
          auVar41._0_4_ = (uint)local_2b8 & uVar36;
          auVar41._8_4_ = uStack_2b0 & (uStack_2b0 ^ 0x80000000);
          auVar41._12_4_ = uStack_2ac & (uStack_2ac ^ 0x80000000);
          auVar41 = ZEXT416(~uVar36 & (uint)-local_2b8) | auVar41;
          auVar40._4_12_ = auVar41._4_12_;
          auVar40._0_4_ = auVar41._0_4_ * fVar37;
          uStack_2b4 = auVar41._4_4_;
          uStack_2b0 = auVar41._8_4_;
          uStack_2ac = auVar41._12_4_;
          local_2b8 = auVar40._0_4_;
          uVar11 = local_2e8._4_4_;
          uVar36 = uStack_2e0;
          uVar18 = uStack_2dc;
        }
      }
      else {
        local_2b8 = local_2b8 * fVar37;
      }
    }
    else {
      local_2b8 = 0.0;
      uStack_2b4 = 0;
      uStack_2b0 = 0;
      uStack_2ac = 0;
    }
  }
  else {
    local_2c8._4_4_ = in_register_00001244._0_4_;
    local_2c8._8_4_ = in_register_00001244._4_4_;
    local_2c8._12_4_ = in_register_00001244._8_4_;
    local_2c8._0_4_ = t;
    local_2e8._0_4_ = s;
  }
  uVar39 = auVar40._0_8_;
  local_2f0 = sampler;
  if ((int)offset == 0) {
    WVar28 = sampler->wrapR;
    FVar2 = sampler->minFilter;
    fVar37 = (float)local_2e8;
    local_2e8 = (ulong)sampler->magFilter;
    fVar37 = floorf(fVar37);
    WVar26 = (int)fVar37 + *in_R8;
    fVar37 = floorf((float)local_2c8._0_4_);
    FVar20 = (int)fVar37 + in_R8[1];
    fVar37 = floorf(local_2b8);
    pSVar9 = local_2f0;
    if (((sampler_00->wrapS != CLAMP_TO_BORDER) || ((int)WVar26 < (int)WVar28 && -1 < (int)WVar26))
       && ((sampler_00->wrapT != CLAMP_TO_BORDER || ((int)FVar20 < (int)FVar2 && -1 < (int)FVar20)))
       ) {
      if ((sampler_00->wrapR != CLAMP_TO_BORDER) ||
         (-1 < (int)fVar37 + in_R8[2] && (int)fVar37 + in_R8[2] < (int)(float)local_2e8)) {
        WVar27 = WVar26;
        WVar22 = CLAMP_TO_EDGE;
        switch(sampler_00->wrapS) {
        case CLAMP_TO_EDGE:
        case MIRRORED_REPEAT_CL:
          WVar27 = WVar28 - CLAMP_TO_BORDER;
          if ((int)WVar26 < (int)(WVar28 - CLAMP_TO_BORDER)) {
            WVar27 = WVar26;
          }
          WVar22 = CLAMP_TO_EDGE;
          if (-1 < (int)WVar26) {
            WVar22 = WVar27;
          }
          break;
        case CLAMP_TO_BORDER:
          if ((int)WVar26 < (int)WVar28) {
            WVar28 = WVar26;
          }
          WVar22 = ~CLAMP_TO_EDGE;
          if (-2 < (int)WVar26) {
            WVar22 = WVar28;
          }
          break;
        case REPEAT_GL:
        case REPEAT_CL:
          WVar22 = ((int)WVar26 % (int)WVar28 >> 0x1f & WVar28) + (int)WVar26 % (int)WVar28;
          break;
        case MIRRORED_ONCE:
          WVar27 = WVar28;
          if ((int)WVar26 < (int)WVar28) {
            WVar27 = WVar26;
          }
          if (SBORROW4(WVar26,-WVar28) != (int)(WVar26 + WVar28) < 0) {
            WVar27 = -WVar28;
          }
        case MIRRORED_REPEAT_GL:
          iVar17 = (int)WVar27 % (int)(WVar28 * 2);
          uVar36 = (iVar17 - WVar28) + (iVar17 >> 0x1f & WVar28 * 2);
          WVar22 = ~((int)uVar36 >> 0x1f ^ uVar36) + WVar28;
        }
        FVar21 = FVar20;
        k = NEAREST;
        switch(sampler_00->wrapT) {
        case CLAMP_TO_EDGE:
        case MIRRORED_REPEAT_CL:
          FVar21 = FVar2 - LINEAR;
          if ((int)FVar20 < (int)(FVar2 - LINEAR)) {
            FVar21 = FVar20;
          }
          k = NEAREST;
          if (-1 < (int)FVar20) {
            k = FVar21;
          }
          break;
        case CLAMP_TO_BORDER:
          if ((int)FVar20 < (int)FVar2) {
            FVar2 = FVar20;
          }
          k = ~NEAREST;
          if (-2 < (int)FVar20) {
            k = FVar2;
          }
          break;
        case REPEAT_GL:
        case REPEAT_CL:
          k = ((int)FVar20 % (int)FVar2 >> 0x1f & FVar2) + (int)FVar20 % (int)FVar2;
          break;
        case MIRRORED_ONCE:
          FVar21 = FVar2;
          if ((int)FVar20 < (int)FVar2) {
            FVar21 = FVar20;
          }
          if (SBORROW4(FVar20,-FVar2) != (int)(FVar20 + FVar2) < 0) {
            FVar21 = -FVar2;
          }
        case MIRRORED_REPEAT_GL:
          iVar17 = (int)FVar21 % (int)(FVar2 * 2);
          uVar36 = (iVar17 - FVar2) + (iVar17 >> 0x1f & FVar2 * 2);
          k = ~((int)uVar36 >> 0x1f ^ uVar36) + FVar2;
        }
        switch(sampler_00->wrapR) {
        case CLAMP_TO_EDGE:
        case MIRRORED_REPEAT_CL:
          break;
        case CLAMP_TO_BORDER:
          break;
        case REPEAT_GL:
        case REPEAT_CL:
          break;
        case MIRRORED_REPEAT_GL:
          break;
        case MIRRORED_ONCE:
        }
        VVar46 = lookup(this,(int)local_2f0,WVar22,k);
        VVar46.m_data[0] = VVar46.m_data[0];
        auVar58._4_4_ = VVar46.m_data[1];
        register0x00001240 = VVar46.m_data[2];
        register0x00001244 = VVar46.m_data[3];
        return (Vec4)VVar46.m_data;
      }
    }
    TVar13 = getTextureChannelClass(local_2f0->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      VVar45 = sampleTextureBorder<float>((tcu *)this,(TextureFormat *)pSVar9,sampler_00);
      VVar51.m_data[0] = VVar45.m_data[0];
      auVar57._4_4_ = VVar45.m_data[1];
      register0x00001240 = VVar45.m_data[2];
      register0x00001244 = VVar45.m_data[3];
      return (Vec4)VVar51.m_data;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      (this->m_format).order = R;
      (this->m_format).type = SNORM_INT8;
      (this->m_size).m_data[0] = 0;
      (this->m_size).m_data[1] = 0;
      lVar14 = 0;
      do {
        fVar37 = (float)*(int *)((long)&local_308 + lVar14 * 4);
        (this->m_size).m_data[lVar14 + -2] = (int)fVar37;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      VVar48.m_data[0] = fVar37;
      auVar54._4_4_ = 0.0;
      register0x00001240 = (float)(int)uVar39;
      register0x00001244 = (float)(int)(uVar39 >> 0x20);
      return (Vec4)VVar48.m_data;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      (this->m_format).order = R;
      (this->m_format).type = SNORM_INT8;
      (this->m_size).m_data[0] = 0;
      (this->m_size).m_data[1] = 0;
      lVar14 = 0;
      do {
        fVar37 = (float)*(uint *)((long)&local_308 + lVar14 * 4);
        (this->m_size).m_data[lVar14 + -2] = (int)fVar37;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      VVar49.m_data[0] = fVar37;
      auVar55._4_4_ = 0.0;
      register0x00001240 = (float)(int)uVar39;
      register0x00001244 = (float)(int)(uVar39 >> 0x20);
      return (Vec4)VVar49.m_data;
    default:
      lVar14 = 0;
      do {
        (this->m_size).m_data[lVar14 + -2] = -0x40800000;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      VVar50.m_data[0] = (float)(int)extraout_XMM0_Qa;
      auVar56._4_4_ = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
      register0x00001240 = (float)(int)uVar39;
      register0x00001244 = (float)(int)(uVar39 >> 0x20);
      return (Vec4)VVar50.m_data;
    }
  }
  if ((int)offset != 1) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar39;
    afVar7 = (float  [4])(auVar8 << 0x40);
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    VVar52.m_data[0] = afVar7[0];
    auVar59._4_4_ = afVar7[1];
    register0x00001240 = afVar7[2];
    register0x00001244 = afVar7[3];
    return (Vec4)VVar52.m_data;
  }
  WVar28 = sampler->wrapR;
  local_298 = (ulong)sampler->minFilter;
  local_2a0 = (ulong)sampler->magFilter;
  local_2e8._0_4_ = (float)local_2e8 + -0.5;
  local_2e8 = CONCAT44(uVar11,(float)local_2e8);
  uStack_2e0 = uVar36;
  uStack_2dc = uVar18;
  local_2d0 = floorf((float)local_2e8);
  iVar25 = (int)local_2d0;
  iVar17 = *in_R8;
  iVar1 = in_R8[1];
  local_2c8._0_4_ = (float)local_2c8._0_4_ + -0.5;
  local_28c = floorf((float)local_2c8._0_4_);
  local_2b8 = local_2b8 + -0.5;
  local_2cc = floorf(local_2b8);
  WVar26 = sampler_00->wrapS;
  local_31c = CLAMP_TO_EDGE;
  if (WVar26 < WRAPMODE_LAST) {
    WVar27 = iVar17 + iVar25;
    WVar22 = WVar27;
    switch(WVar26) {
    default:
      WVar22 = WVar28 - CLAMP_TO_BORDER;
      if ((int)WVar27 < (int)(WVar28 - CLAMP_TO_BORDER)) {
        WVar22 = WVar27;
      }
      local_31c = CLAMP_TO_EDGE;
      if (-1 < (int)WVar27) {
        local_31c = WVar22;
      }
      break;
    case CLAMP_TO_BORDER:
      WVar22 = WVar28;
      if ((int)WVar27 < (int)WVar28) {
        WVar22 = WVar27;
      }
      local_31c = ~CLAMP_TO_EDGE;
      if (-2 < (int)WVar27) {
        local_31c = WVar22;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      local_31c = ((int)WVar27 % (int)WVar28 >> 0x1f & WVar28) + (int)WVar27 % (int)WVar28;
      break;
    case MIRRORED_ONCE:
      WVar22 = WVar28;
      if ((int)WVar27 < (int)WVar28) {
        WVar22 = WVar27;
      }
      if (SBORROW4(WVar27,-WVar28) != (int)(WVar27 + WVar28) < 0) {
        WVar22 = -WVar28;
      }
    case MIRRORED_REPEAT_GL:
      iVar16 = (int)WVar22 % (int)(WVar28 * 2);
      uVar36 = (iVar16 - WVar28) + (iVar16 >> 0x1f & WVar28 * 2);
      local_31c = ~((int)uVar36 >> 0x1f ^ uVar36) + WVar28;
    }
  }
  local_2a4 = CLAMP_TO_EDGE;
  if (WVar26 < WRAPMODE_LAST) {
    WVar27 = iVar17 + 1 + iVar25;
    WVar22 = WVar27;
    switch(WVar26) {
    default:
      WVar22 = WVar28 - CLAMP_TO_BORDER;
      if ((int)WVar27 < (int)(WVar28 - CLAMP_TO_BORDER)) {
        WVar22 = WVar27;
      }
      local_2a4 = CLAMP_TO_EDGE;
      if (-1 < (int)WVar27) {
        local_2a4 = WVar22;
      }
      break;
    case CLAMP_TO_BORDER:
      WVar22 = WVar28;
      if ((int)WVar27 < (int)WVar28) {
        WVar22 = WVar27;
      }
      local_2a4 = ~CLAMP_TO_EDGE;
      if (-2 < (int)WVar27) {
        local_2a4 = WVar22;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      local_2a4 = ((int)WVar27 % (int)WVar28 >> 0x1f & WVar28) + (int)WVar27 % (int)WVar28;
      break;
    case MIRRORED_ONCE:
      WVar22 = WVar28;
      if ((int)WVar27 < (int)WVar28) {
        WVar22 = WVar27;
      }
      if (SBORROW4(WVar27,-WVar28) != (int)(WVar27 + WVar28) < 0) {
        WVar22 = -WVar28;
      }
    case MIRRORED_REPEAT_GL:
      iVar17 = (int)WVar22 % (int)(WVar28 * 2);
      uVar36 = (iVar17 - WVar28) + (iVar17 >> 0x1f & WVar28 * 2);
      local_2a4 = ~((int)uVar36 >> 0x1f ^ uVar36) + WVar28;
    }
  }
  WVar27 = sampler_00->wrapT;
  local_30c = 0;
  uVar36 = (uint)local_298;
  local_2a8 = 0;
  if (WVar27 < WRAPMODE_LAST) {
    uVar18 = iVar1 + (int)local_28c;
    uVar11 = uVar18;
    switch(WVar27) {
    default:
      uVar11 = uVar36 - 1;
      if ((int)uVar18 < (int)(uVar36 - 1)) {
        uVar11 = uVar18;
      }
      local_2a8 = 0;
      if (-1 < (int)uVar18) {
        local_2a8 = uVar11;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar11 = uVar36;
      if ((int)uVar18 < (int)uVar36) {
        uVar11 = uVar18;
      }
      local_2a8 = 0xffffffff;
      if (-2 < (int)uVar18) {
        local_2a8 = uVar11;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      local_2a8 = ((int)uVar18 % (int)uVar36 >> 0x1f & uVar36) + (int)uVar18 % (int)uVar36;
      break;
    case MIRRORED_ONCE:
      uVar11 = uVar36;
      if ((int)uVar18 < (int)uVar36) {
        uVar11 = uVar18;
      }
      if (SBORROW4(uVar18,-uVar36) != (int)(uVar18 + uVar36) < 0) {
        uVar11 = -uVar36;
      }
    case MIRRORED_REPEAT_GL:
      iVar17 = (int)uVar11 % (int)(uVar36 * 2);
      uVar18 = (iVar17 - uVar36) + (iVar17 >> 0x1f & uVar36 * 2);
      local_2a8 = ~((int)uVar18 >> 0x1f ^ uVar18) + uVar36;
    }
  }
  if (WVar27 < WRAPMODE_LAST) {
    uVar11 = iVar1 + (int)local_28c + 1;
    uVar18 = uVar11;
    switch(WVar27) {
    default:
      uVar18 = uVar36 - 1;
      if ((int)uVar11 < (int)(uVar36 - 1)) {
        uVar18 = uVar11;
      }
      local_30c = 0;
      if (-1 < (int)uVar11) {
        local_30c = uVar18;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar18 = uVar36;
      if ((int)uVar11 < (int)uVar36) {
        uVar18 = uVar11;
      }
      local_30c = 0xffffffff;
      if (-2 < (int)uVar11) {
        local_30c = uVar18;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      local_30c = ((int)uVar11 % (int)uVar36 >> 0x1f & uVar36) + (int)uVar11 % (int)uVar36;
      break;
    case MIRRORED_ONCE:
      uVar18 = uVar36;
      if ((int)uVar11 < (int)uVar36) {
        uVar18 = uVar11;
      }
      if (SBORROW4(uVar11,-uVar36) != (int)(uVar11 + uVar36) < 0) {
        uVar18 = -uVar36;
      }
    case MIRRORED_REPEAT_GL:
      iVar17 = (int)uVar18 % (int)(uVar36 * 2);
      uVar18 = (iVar17 - uVar36) + (iVar17 >> 0x1f & uVar36 * 2);
      local_30c = ~((int)uVar18 >> 0x1f ^ uVar18) + uVar36;
    }
  }
  WVar22 = sampler_00->wrapR;
  local_310 = 0;
  uVar11 = (uint)local_2a0;
  uVar18 = 0;
  if (WVar22 < WRAPMODE_LAST) {
    uVar44 = in_R8[2] + (int)local_2cc;
    uVar18 = uVar44;
    switch(WVar22) {
    default:
      uVar12 = uVar11 - 1;
      if ((int)uVar44 < (int)(uVar11 - 1)) {
        uVar12 = uVar44;
      }
      uVar18 = 0;
      if (-1 < (int)uVar44) {
        uVar18 = uVar12;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar12 = uVar11;
      if ((int)uVar44 < (int)uVar11) {
        uVar12 = uVar44;
      }
      uVar18 = 0xffffffff;
      if (-2 < (int)uVar44) {
        uVar18 = uVar12;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      uVar18 = ((int)uVar44 % (int)uVar11 >> 0x1f & uVar11) + (int)uVar44 % (int)uVar11;
      break;
    case MIRRORED_ONCE:
      uVar18 = uVar11;
      if ((int)uVar44 < (int)uVar11) {
        uVar18 = uVar44;
      }
      if (SBORROW4(uVar44,-uVar11) != (int)(uVar44 + uVar11) < 0) {
        uVar18 = -uVar11;
      }
    case MIRRORED_REPEAT_GL:
      iVar17 = (int)uVar18 % (int)(uVar11 * 2);
      uVar18 = (iVar17 - uVar11) + (iVar17 >> 0x1f & uVar11 * 2);
      uVar18 = ~((int)uVar18 >> 0x1f ^ uVar18) + uVar11;
    }
  }
  if (WVar22 < WRAPMODE_LAST) {
    uVar12 = in_R8[2] + (int)local_2cc + 1;
    uVar44 = uVar12;
    switch(WVar22) {
    default:
      uVar44 = uVar11 - 1;
      if ((int)uVar12 < (int)(uVar11 - 1)) {
        uVar44 = uVar12;
      }
      local_310 = 0;
      if (-1 < (int)uVar12) {
        local_310 = uVar44;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar44 = uVar11;
      if ((int)uVar12 < (int)uVar11) {
        uVar44 = uVar12;
      }
      local_310 = 0xffffffff;
      if (-2 < (int)uVar12) {
        local_310 = uVar44;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      local_310 = ((int)uVar12 % (int)uVar11 >> 0x1f & uVar11) + (int)uVar12 % (int)uVar11;
      break;
    case MIRRORED_ONCE:
      uVar44 = uVar11;
      if ((int)uVar12 < (int)uVar11) {
        uVar44 = uVar12;
      }
      if (SBORROW4(uVar12,-uVar11) != (int)(uVar12 + uVar11) < 0) {
        uVar44 = -uVar11;
      }
    case MIRRORED_REPEAT_GL:
      iVar17 = (int)uVar44 % (int)(uVar11 * 2);
      uVar44 = (iVar17 - uVar11) + (iVar17 >> 0x1f & uVar11 * 2);
      local_310 = ~((int)uVar44 >> 0x1f ^ uVar44) + uVar11;
    }
  }
  bVar29 = WVar26 == CLAMP_TO_BORDER;
  bVar19 = ((int)WVar28 <= (int)local_31c || (int)local_31c < 0) && bVar29;
  bVar32 = (int)local_2a4 < 0;
  bVar3 = (int)WVar28 <= (int)local_2a4;
  bVar15 = (bVar3 || bVar32) && bVar29;
  bVar30 = WVar27 == CLAMP_TO_BORDER;
  bVar33 = (int)local_2a8 < 0;
  bVar4 = (int)uVar36 <= (int)local_2a8;
  bVar23 = (bVar4 || bVar33) && bVar30;
  bVar34 = (int)local_30c < 0;
  bVar5 = (int)uVar36 <= (int)local_30c;
  bVar31 = WVar22 == CLAMP_TO_BORDER;
  bVar35 = (int)uVar18 < 0;
  bVar6 = (int)uVar11 <= (int)uVar18;
  local_298 = CONCAT71(local_298._1_7_,bVar31);
  bVar10 = bVar19 || bVar23;
  local_2a0 = CONCAT71(local_2a0._1_7_,bVar10);
  if ((bVar10) || ((bVar6 || bVar35) && bVar31)) {
    TVar13 = getTextureChannelClass(local_2f0->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_218,(TextureFormat *)local_2f0,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_308,(TextureFormat *)local_2f0,sampler_00);
      local_218._0_4_ = R;
      local_218._4_4_ = SNORM_INT8;
      local_218._8_4_ = 0;
      local_218._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_218 + lVar14 * 4) = (float)*(int *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_308,(TextureFormat *)local_2f0,sampler_00);
      local_218._0_4_ = R;
      local_218._4_4_ = SNORM_INT8;
      local_218._8_4_ = 0;
      local_218._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_218 + lVar14 * 4) = (float)*(uint *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    default:
      lVar14 = 0;
      do {
        *(undefined4 *)(local_218 + lVar14 * 4) = 0xbf800000;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_218,(int)local_2f0,local_31c,local_2a8);
  }
  pSVar9 = local_2f0;
  bVar10 = bVar30 && (bVar5 || bVar34);
  if (((bVar4 || bVar33) && bVar30 || (bVar3 || bVar32) && bVar29) || (bVar6 || bVar35) && bVar31) {
    TVar13 = getTextureChannelClass(local_2f0->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_228,(TextureFormat *)pSVar9,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      local_228._0_4_ = R;
      local_228._4_4_ = SNORM_INT8;
      local_228._8_4_ = 0;
      local_228._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_228 + lVar14 * 4) = (float)*(int *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      local_228._0_4_ = R;
      local_228._4_4_ = SNORM_INT8;
      local_228._8_4_ = 0;
      local_228._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_228 + lVar14 * 4) = (float)*(uint *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    default:
      lVar14 = 0;
      do {
        *(undefined4 *)(local_228 + lVar14 * 4) = 0xbf800000;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_228,(int)local_2f0,local_2a4,local_2a8);
  }
  if ((((int)WVar28 <= (int)local_31c || (int)local_31c < 0) && bVar29 ||
      bVar30 && (bVar5 || bVar34)) || (bVar6 || bVar35) && bVar31) {
    TVar13 = getTextureChannelClass(local_2f0->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_238,(TextureFormat *)local_2f0,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_308,(TextureFormat *)local_2f0,sampler_00);
      local_238._0_4_ = R;
      local_238._4_4_ = SNORM_INT8;
      local_238._8_4_ = 0;
      local_238._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_238 + lVar14 * 4) = (float)*(int *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_308,(TextureFormat *)local_2f0,sampler_00);
      local_238._0_4_ = R;
      local_238._4_4_ = SNORM_INT8;
      local_238._8_4_ = 0;
      local_238._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_238 + lVar14 * 4) = (float)*(uint *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    default:
      lVar14 = 0;
      do {
        *(undefined4 *)(local_238 + lVar14 * 4) = 0xbf800000;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_238,(int)local_2f0,local_31c,local_30c);
  }
  pSVar9 = local_2f0;
  local_298 = CONCAT71(local_298._1_7_,
                       (byte)local_298 & ((int)local_310 < 0 || (int)uVar11 <= (int)local_310));
  iVar17 = (int)local_2f0;
  if ((!bVar6 && !bVar35 || !bVar31) &&
      ((!bVar3 && !bVar32 || !bVar29) && (!bVar30 || !bVar5 && !bVar34))) {
    lookup((ConstPixelBufferAccess *)local_248,iVar17,local_2a4,local_30c);
    bVar24 = (byte)local_298;
    goto LAB_0090e160;
  }
  TVar13 = getTextureChannelClass(local_2f0->wrapT);
  bVar24 = (byte)local_298;
  switch(TVar13) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    sampleTextureBorder<float>((tcu *)local_248,(TextureFormat *)pSVar9,sampler_00);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    sampleTextureBorder<int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
    local_248._0_4_ = R;
    local_248._4_4_ = SNORM_INT8;
    local_248._8_4_ = 0;
    local_248._12_4_ = 0;
    lVar14 = 0;
    do {
      *(float *)(local_248 + lVar14 * 4) = (float)*(int *)((long)&local_308 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    sampleTextureBorder<unsigned_int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
    local_248._0_4_ = R;
    local_248._4_4_ = SNORM_INT8;
    local_248._8_4_ = 0;
    local_248._12_4_ = 0;
    lVar14 = 0;
    do {
      *(float *)(local_248 + lVar14 * 4) = (float)*(uint *)((long)&local_308 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    break;
  default:
    lVar14 = 0;
    do {
      *(undefined4 *)(local_248 + lVar14 * 4) = 0xbf800000;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    goto LAB_0090e167;
  }
LAB_0090e160:
LAB_0090e167:
  if (((byte)local_2a0 | bVar24) == 1) {
    TVar13 = getTextureChannelClass(pSVar9->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_258,(TextureFormat *)pSVar9,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      local_258._0_4_ = R;
      local_258._4_4_ = SNORM_INT8;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_258 + lVar14 * 4) = (float)*(int *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      local_258._0_4_ = R;
      local_258._4_4_ = SNORM_INT8;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_258 + lVar14 * 4) = (float)*(uint *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    default:
      lVar14 = 0;
      do {
        *(undefined4 *)(local_258 + lVar14 * 4) = 0xbf800000;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_258,iVar17,local_31c,local_2a8);
  }
  WVar28 = local_2a4;
  if (((bVar23 || bVar15) | bVar24) == 1) {
    TVar13 = getTextureChannelClass(pSVar9->wrapT);
    WVar28 = local_2a4;
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_268,(TextureFormat *)pSVar9,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      local_268._0_4_ = R;
      local_268._4_4_ = SNORM_INT8;
      local_268._8_4_ = 0;
      local_268._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_268 + lVar14 * 4) = (float)*(int *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      local_268._0_4_ = R;
      local_268._4_4_ = SNORM_INT8;
      local_268._8_4_ = 0;
      local_268._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_268 + lVar14 * 4) = (float)*(uint *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    default:
      lVar14 = 0;
      do {
        *(undefined4 *)(local_268 + lVar14 * 4) = 0xbf800000;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_268,iVar17,local_2a4,local_2a8);
  }
  if (((bVar19 || bVar10) | bVar24) != 1) {
    lookup((ConstPixelBufferAccess *)local_278,iVar17,local_31c,local_30c);
    goto LAB_0090e29e;
  }
  TVar13 = getTextureChannelClass(pSVar9->wrapT);
  switch(TVar13) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    sampleTextureBorder<float>((tcu *)local_278,(TextureFormat *)pSVar9,sampler_00);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    sampleTextureBorder<int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
    local_278._0_4_ = R;
    local_278._4_4_ = SNORM_INT8;
    local_278._8_4_ = 0;
    local_278._12_4_ = 0;
    lVar14 = 0;
    do {
      *(float *)(local_278 + lVar14 * 4) = (float)*(int *)((long)&local_308 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    sampleTextureBorder<unsigned_int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
    local_278._0_4_ = R;
    local_278._4_4_ = SNORM_INT8;
    local_278._8_4_ = 0;
    local_278._12_4_ = 0;
    lVar14 = 0;
    do {
      *(float *)(local_278 + lVar14 * 4) = (float)*(uint *)((long)&local_308 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    break;
  default:
    lVar14 = 0;
    do {
      *(undefined4 *)(local_278 + lVar14 * 4) = 0xbf800000;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    goto LAB_0090e2a9;
  }
LAB_0090e29e:
LAB_0090e2a9:
  local_2e8 = CONCAT44(local_2e8._4_4_,(float)local_2e8 - local_2d0);
  if (((bVar15 || bVar10) | bVar24) == 1) {
    TVar13 = getTextureChannelClass(pSVar9->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_288,(TextureFormat *)pSVar9,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      local_288._0_4_ = R;
      local_288._4_4_ = SNORM_INT8;
      local_288._8_4_ = 0;
      local_288._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_288 + lVar14 * 4) = (float)*(int *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_308,(TextureFormat *)pSVar9,sampler_00);
      local_288._0_4_ = R;
      local_288._4_4_ = SNORM_INT8;
      local_288._8_4_ = 0;
      local_288._12_4_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_288 + lVar14 * 4) = (float)*(uint *)((long)&local_308 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      break;
    default:
      lVar14 = 0;
      do {
        *(undefined4 *)(local_288 + lVar14 * 4) = 0xbf800000;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      goto LAB_0090e32c;
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_288,iVar17,WVar28,local_30c);
  }
LAB_0090e32c:
  local_2c8._0_4_ = (float)local_2c8._0_4_ - local_28c;
  local_2b8 = local_2b8 - local_2cc;
  fVar37 = 1.0 - (float)local_2e8;
  local_1e8[0x4c] = 0.0;
  local_1e8[0x4d] = 0.0;
  local_1e8[0x4e] = 0.0;
  local_1e8[0x4f] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x4c] = *(float *)(local_218 + lVar14 * 4) * fVar37;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  fVar43 = 1.0 - (float)local_2c8._0_4_;
  local_1e8[0x50] = 0.0;
  local_1e8[0x51] = 0.0;
  local_1e8[0x52] = 0.0;
  local_1e8[0x53] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x50] = local_1e8[lVar14 + 0x4c] * fVar43;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  fVar42 = 1.0 - local_2b8;
  local_1e8[0x54] = 0.0;
  local_1e8[0x55] = 0.0;
  local_1e8[0x56] = 0.0;
  local_1e8[0x57] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x54] = local_1e8[lVar14 + 0x50] * fVar42;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x40] = 0.0;
  local_1e8[0x41] = 0.0;
  local_1e8[0x42] = 0.0;
  local_1e8[0x43] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x40] = *(float *)(local_228 + lVar14 * 4) * (float)local_2e8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x44] = 0.0;
  local_1e8[0x45] = 0.0;
  local_1e8[0x46] = 0.0;
  local_1e8[0x47] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x44] = local_1e8[lVar14 + 0x40] * fVar43;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x48] = 0.0;
  local_1e8[0x49] = 0.0;
  local_1e8[0x4a] = 0.0;
  local_1e8[0x4b] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x48] = local_1e8[lVar14 + 0x44] * fVar42;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x58] = 0.0;
  local_1e8[0x59] = 0.0;
  local_1e8[0x5a] = 0.0;
  local_1e8[0x5b] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x58] = local_1e8[lVar14 + 0x54] + local_1e8[lVar14 + 0x48];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x34] = 0.0;
  local_1e8[0x35] = 0.0;
  local_1e8[0x36] = 0.0;
  local_1e8[0x37] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x34] = *(float *)(local_238 + lVar14 * 4) * fVar37;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x38] = 0.0;
  local_1e8[0x39] = 0.0;
  local_1e8[0x3a] = 0.0;
  local_1e8[0x3b] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x38] = local_1e8[lVar14 + 0x34] * (float)local_2c8._0_4_;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x3c] = 0.0;
  local_1e8[0x3d] = 0.0;
  local_1e8[0x3e] = 0.0;
  local_1e8[0x3f] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x3c] = local_1e8[lVar14 + 0x38] * fVar42;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x5c] = 0.0;
  local_1e8[0x5d] = 0.0;
  local_1e8[0x5e] = 0.0;
  local_1e8[0x5f] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x5c] = local_1e8[lVar14 + 0x58] + local_1e8[lVar14 + 0x3c];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x28] = 0.0;
  local_1e8[0x29] = 0.0;
  local_1e8[0x2a] = 0.0;
  local_1e8[0x2b] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x28] = *(float *)(local_248 + lVar14 * 4) * (float)local_2e8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x2c] = 0.0;
  local_1e8[0x2d] = 0.0;
  local_1e8[0x2e] = 0.0;
  local_1e8[0x2f] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x2c] = local_1e8[lVar14 + 0x28] * (float)local_2c8._0_4_;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x30] = 0.0;
  local_1e8[0x31] = 0.0;
  local_1e8[0x32] = 0.0;
  local_1e8[0x33] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x30] = local_1e8[lVar14 + 0x2c] * fVar42;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x60] = 0.0;
  local_1e8[0x61] = 0.0;
  local_1e8[0x62] = 0.0;
  local_1e8[99] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x60] = local_1e8[lVar14 + 0x5c] + local_1e8[lVar14 + 0x30];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x1c] = 0.0;
  local_1e8[0x1d] = 0.0;
  local_1e8[0x1e] = 0.0;
  local_1e8[0x1f] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x1c] = *(float *)(local_258 + lVar14 * 4) * fVar37;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x20] = 0.0;
  local_1e8[0x21] = 0.0;
  local_1e8[0x22] = 0.0;
  local_1e8[0x23] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x20] = local_1e8[lVar14 + 0x1c] * fVar43;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x24] = 0.0;
  local_1e8[0x25] = 0.0;
  local_1e8[0x26] = 0.0;
  local_1e8[0x27] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x24] = local_1e8[lVar14 + 0x20] * local_2b8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[100] = 0.0;
  local_1e8[0x65] = 0.0;
  local_1e8[0x66] = 0.0;
  local_1e8[0x67] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 100] = local_1e8[lVar14 + 0x60] + local_1e8[lVar14 + 0x24];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x10] = 0.0;
  local_1e8[0x11] = 0.0;
  local_1e8[0x12] = 0.0;
  local_1e8[0x13] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x10] = *(float *)(local_268 + lVar14 * 4) * (float)local_2e8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x14] = 0.0;
  local_1e8[0x15] = 0.0;
  local_1e8[0x16] = 0.0;
  local_1e8[0x17] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x14] = local_1e8[lVar14 + 0x10] * fVar43;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x18] = 0.0;
  local_1e8[0x19] = 0.0;
  local_1e8[0x1a] = 0.0;
  local_1e8[0x1b] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x18] = local_1e8[lVar14 + 0x14] * local_2b8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0x68] = 0.0;
  local_1e8[0x69] = 0.0;
  local_1e8[0x6a] = 0.0;
  local_1e8[0x6b] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0x68] = local_1e8[lVar14 + 100] + local_1e8[lVar14 + 0x18];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[4] = 0.0;
  local_1e8[5] = 0.0;
  local_1e8[6] = 0.0;
  local_1e8[7] = 0.0;
  lVar14 = 0;
  do {
    fVar43 = *(float *)(local_278 + lVar14 * 4);
    local_1e8[lVar14 + 4] = fVar43 * fVar37;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[8] = 0.0;
  local_1e8[9] = 0.0;
  local_1e8[10] = 0.0;
  local_1e8[0xb] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 8] = local_1e8[lVar14 + 4] * (float)local_2c8._0_4_;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0xc] = 0.0;
  local_1e8[0xd] = 0.0;
  local_1e8[0xe] = 0.0;
  local_1e8[0xf] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14 + 0xc] = local_1e8[lVar14 + 8] * local_2b8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_308 = 0;
  uStack_300 = 0;
  lVar14 = 0;
  do {
    *(float *)((long)&local_308 + lVar14 * 4) = local_1e8[lVar14 + 0x68] + local_1e8[lVar14 + 0xc];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_218._16_8_ = (void *)0x0;
  afStack_200[0] = 0.0;
  afStack_200[1] = 0.0;
  lVar14 = 0;
  do {
    afStack_200[lVar14 + -2] = *(float *)(local_288 + lVar14 * 4) * (float)local_2e8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1f8 = (void *)0x0;
  uStack_1f0 = 0;
  lVar14 = 0;
  do {
    *(float *)((long)&local_1f8 + lVar14 * 4) = afStack_200[lVar14 + -2] * (float)local_2c8._0_4_;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_1e8[0] = 0.0;
  local_1e8[1] = 0.0;
  local_1e8[2] = 0.0;
  local_1e8[3] = 0.0;
  lVar14 = 0;
  do {
    local_1e8[lVar14] = *(float *)((long)&local_1f8 + lVar14 * 4) * local_2b8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  (this->m_format).order = R;
  (this->m_format).type = SNORM_INT8;
  (this->m_size).m_data[0] = 0;
  (this->m_size).m_data[1] = 0;
  lVar14 = 0;
  do {
    fVar42 = *(float *)((long)&local_308 + lVar14 * 4) + local_1e8[lVar14];
    (this->m_size).m_data[lVar14 + -2] = (int)fVar42;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  VVar47.m_data[0] = fVar42;
  auVar53._4_4_ = 0.0;
  register0x00001240 = fVar43 * fVar37;
  register0x00001244 = 0.0;
  return (Vec4)VVar47.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample3DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, float t, float r, const IVec3& offset) const
{
	// Non-normalized coordinates.
	float u = s;
	float v = t;
	float w = r;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
		w = unnormalize(sampler.wrapR, r, m_size.z());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest3D	(*this, sampler, u, v, w, offset);
		case Sampler::LINEAR:	return sampleLinear3D	(*this, sampler, u, v, w, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}